

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunmatrix_dense.c
# Opt level: O3

void SUNDenseMatrix_Print(SUNMatrix A,FILE *outfile)

{
  long *plVar1;
  long lVar2;
  long lVar3;
  
  fputc(10,(FILE *)outfile);
  plVar1 = (long *)A->content;
  if (0 < *plVar1) {
    lVar2 = 0;
    do {
      if (0 < plVar1[1]) {
        lVar3 = 0;
        do {
          fprintf((FILE *)outfile,"%12g  ",
                  *(undefined8 *)(*(long *)(plVar1[4] + lVar3 * 8) + lVar2 * 8));
          lVar3 = lVar3 + 1;
          plVar1 = (long *)A->content;
        } while (lVar3 < plVar1[1]);
      }
      fputc(10,(FILE *)outfile);
      lVar2 = lVar2 + 1;
      plVar1 = (long *)A->content;
    } while (lVar2 < *plVar1);
  }
  fputc(10,(FILE *)outfile);
  return;
}

Assistant:

void SUNDenseMatrix_Print(SUNMatrix A, FILE* outfile)
{
  SUNFunctionBegin(A->sunctx);
  sunindextype i, j;

  SUNAssertVoid(SUNMatGetID(A) == SUNMATRIX_DENSE, SUN_ERR_ARG_WRONGTYPE);

  /* perform operation */
  fprintf(outfile, "\n");
  for (i = 0; i < SM_ROWS_D(A); i++)
  {
    for (j = 0; j < SM_COLUMNS_D(A); j++)
    {
#if defined(SUNDIALS_EXTENDED_PRECISION)
      fprintf(outfile, "%12Lg  ", SM_ELEMENT_D(A, i, j));
#elif defined(SUNDIALS_DOUBLE_PRECISION)
      fprintf(outfile, "%12g  ", SM_ELEMENT_D(A, i, j));
#else
      fprintf(outfile, "%12g  ", SM_ELEMENT_D(A, i, j));
#endif
    }
    fprintf(outfile, "\n");
  }
  fprintf(outfile, "\n");
  return;
}